

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

int Vec_IntTwoRemoveCommon(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vArr)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int *local_50;
  int *pBeg2New;
  int *pBeg1New;
  int *pEnd2;
  int *pEnd1;
  int *pBeg2;
  int *pBeg1;
  Vec_Int_t *vArr_local;
  Vec_Int_t *vArr2_local;
  Vec_Int_t *vArr1_local;
  
  pBeg2 = vArr1->pArray;
  pEnd1 = vArr2->pArray;
  piVar2 = vArr1->pArray;
  iVar4 = vArr1->nSize;
  piVar3 = vArr2->pArray;
  iVar1 = vArr2->nSize;
  pBeg2New = vArr1->pArray;
  local_50 = vArr2->pArray;
  Vec_IntClear(vArr);
  while (pBeg2 < piVar2 + iVar4 && pEnd1 < piVar3 + iVar1) {
    if (*pBeg2 == *pEnd1) {
      Vec_IntPush(vArr,*pBeg2);
      pEnd1 = pEnd1 + 1;
      pBeg2 = pBeg2 + 1;
    }
    else if (*pBeg2 < *pEnd1) {
      *pBeg2New = *pBeg2;
      pBeg2New = pBeg2New + 1;
      pBeg2 = pBeg2 + 1;
    }
    else {
      *local_50 = *pEnd1;
      local_50 = local_50 + 1;
      pEnd1 = pEnd1 + 1;
    }
  }
  while (pBeg2 < piVar2 + iVar4) {
    *pBeg2New = *pBeg2;
    pBeg2New = pBeg2New + 1;
    pBeg2 = pBeg2 + 1;
  }
  while (pEnd1 < piVar3 + iVar1) {
    *local_50 = *pEnd1;
    local_50 = local_50 + 1;
    pEnd1 = pEnd1 + 1;
  }
  Vec_IntShrink(vArr1,(int)((long)pBeg2New - (long)vArr1->pArray >> 2));
  Vec_IntShrink(vArr2,(int)((long)local_50 - (long)vArr2->pArray >> 2));
  iVar4 = Vec_IntSize(vArr);
  return iVar4;
}

Assistant:

static inline int Vec_IntTwoRemoveCommon( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vArr )
{
    int * pBeg1 = vArr1->pArray;
    int * pBeg2 = vArr2->pArray;
    int * pEnd1 = vArr1->pArray + vArr1->nSize;
    int * pEnd2 = vArr2->pArray + vArr2->nSize;
    int * pBeg1New = vArr1->pArray;
    int * pBeg2New = vArr2->pArray;
    Vec_IntClear( vArr );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            Vec_IntPush( vArr, *pBeg1 ), pBeg1++, pBeg2++;
        else if ( *pBeg1 < *pBeg2 )
            *pBeg1New++ = *pBeg1++;
        else 
            *pBeg2New++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pBeg1New++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pBeg2New++ = *pBeg2++;
    Vec_IntShrink( vArr1, pBeg1New - vArr1->pArray );
    Vec_IntShrink( vArr2, pBeg2New - vArr2->pArray );
    return Vec_IntSize(vArr);
}